

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.cpp
# Opt level: O0

void * SRF02Thread(void *pParam)

{
  timeval tv_00;
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_d58;
  double tab_values [3];
  char local_d38 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_b2c;
  char local_b28 [4];
  int i;
  char szCfgFilePath [256];
  int local_a20;
  int local_a1c;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  double distances3 [16];
  double distances2 [16];
  double distances1 [16];
  double distances [16];
  double angles [16];
  int nbtelemeters;
  int nbvtelemeters;
  int nbhtelemeters;
  timeval tv;
  double z;
  double y;
  double x;
  SRF02 srf02;
  void *pParam_local;
  
  tv.tv_usec = 0;
  chrono_period._68_4_ = 0;
  local_a1c = 0x32;
  local_a20 = 0;
  srf02.d_max_err = (double)pParam;
  sprintf(local_b28,"SRF020.txt");
  memset(&x,0,0x700);
  StartChrono((CHRONO *)&errcount);
LAB_001ac43a:
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      if (bPauseSRF02 == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("SRF02 paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectSRF02((SRF02 *)&x);
      }
      if (bExit != 0) goto LAB_001ad013;
      mSleep(100);
    }
    if (bRestartSRF02 != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a SRF02.\n");
        chrono_period._68_4_ = 0;
        DisconnectSRF02((SRF02 *)&x);
      }
      bRestartSRF02 = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar2 = ConnectSRF02((SRF02 *)&x,local_b28);
      if (iVar2 == 0) {
        chrono_period._68_4_ = 1;
        local_a1c = srf02.nbretries;
        uSleep((long)(srf02.nbretries * 1000));
        memset(&nbvtelemeters,0,0x10);
        memset(distances + 0xf,0,0x80);
        memset(distances1 + 0xf,0,0x80);
        memset(distances2 + 0xf,0,0x80);
        memset(distances3 + 0xf,0,0x80);
        memset(&stack0xfffffffffffff638,0,0x80);
        if (srf02.I2CBus != (HANDLE)0x0) {
          fclose((FILE *)srf02.I2CBus);
          srf02.I2CBus = (HANDLE)0x0;
        }
        if ((srf02.timeout != 0) && (srf02.I2CBus == (HANDLE)0x0)) {
          sVar3 = strlen((char *)(srf02.LastRanges + 0xf));
          if (sVar3 == 0) {
            sprintf(local_d38,"srf02");
          }
          else {
            sprintf(local_d38,"%.127s",srf02.LastRanges + 0xf);
          }
          sVar3 = strlen(local_d38);
          local_b2c = (int)sVar3;
          do {
            local_b2c = local_b2c + -1;
            if (local_b2c < 0) break;
          } while (local_d38[local_b2c] != '.');
          if ((0 < local_b2c) && (sVar3 = strlen(local_d38), local_b2c < (int)sVar3)) {
            sVar3 = strlen(local_d38);
            memset(local_d38 + local_b2c,0,sVar3 - (long)local_b2c);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar4 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_d38,pcVar4);
          LeaveCriticalSection(&strtimeCS);
          srf02.I2CBus = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)srf02.I2CBus == (FILE *)0x0) {
            printf("Unable to create SRF02 data file.\n");
            goto LAB_001ad013;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      if (srf02.bSaveRawData == 0) {
        iVar2 = Get5TelemetersSRF02((SRF02 *)&x,distances1 + 0xf,distances,distances + 1,
                                    distances + 2,distances + 3,10);
        if (iVar2 != 0) {
          printf("Connection to a SRF02 lost.\n");
          chrono_period._68_4_ = 0;
          DisconnectSRF02((SRF02 *)&x);
          uSleep((long)(local_a1c * 1000));
          goto LAB_001ac43a;
        }
        mSleep(10);
      }
      else {
        iVar2 = Get5TelemetersParallelSRF02
                          ((SRF02 *)&x,distances1 + 0xf,distances,distances + 1,distances + 2,
                           distances + 3);
        if (iVar2 != 0) {
          printf("Connection to a SRF02 lost.\n");
          chrono_period._68_4_ = 0;
          DisconnectSRF02((SRF02 *)&x);
          uSleep((long)(local_a1c * 1000));
          goto LAB_001ac43a;
        }
        mSleep(0x14);
      }
      iVar2 = gettimeofday((timeval *)&nbvtelemeters,(__timezone_ptr_t)0x0);
      if (iVar2 != 0) {
        _nbvtelemeters = 0;
        tv.tv_sec = 0;
      }
      if (srf02.RangingDelay != 0) {
        memcpy(&stack0xfffffffffffff638,distances3 + 0xf,0x80);
        memcpy(distances3 + 0xf,distances2 + 0xf,0x80);
        memcpy(distances2 + 0xf,distances1 + 0xf,0x80);
        for (local_b2c = 0; local_b2c < 5; local_b2c = local_b2c + 1) {
          local_d58 = distances2[(long)local_b2c + 0xf];
          tab_values[0] = distances3[(long)local_b2c + 0xf];
          tab_values[1] = *(double *)(&stack0xfffffffffffff638 + (long)local_b2c * 8);
          dVar5 = median(&local_d58,3);
          distances1[(long)local_b2c + 0xf] = dVar5;
        }
      }
      EnterCriticalSection(&StateVariablesCS);
      uVar1 = srf02.addr._56_8_;
      dVar5 = distances1[0xf];
      dVar6 = cos(srf02.theta[0xf]);
      dVar7 = srf02.x[0xf];
      dVar8 = distances1[0xf];
      dVar5 = dVar5 * dVar6 + (double)uVar1;
      dVar6 = sin(srf02.theta[0xf]);
      dVar7 = dVar8 * dVar6 + dVar7;
      distances[0xf] = atan2(dVar7,dVar5);
      dVar5 = sqr(dVar5);
      dVar8 = sqr(dVar7);
      distances1[0xf] = sqrt(dVar5 + dVar8);
      dVar7 = srf02.x[0];
      dVar5 = distances[0];
      dVar9 = cos(srf02.psi[0]);
      dVar6 = srf02.y[0];
      dVar8 = distances[0];
      dVar7 = dVar5 * dVar9 + dVar7;
      dVar5 = sin(srf02.psi[0]);
      dVar6 = dVar8 * dVar5 + dVar6;
      atan2(dVar6,dVar7);
      dVar5 = sqr(dVar7);
      dVar8 = sqr(dVar6);
      distances[0] = sqrt(dVar5 + dVar8);
      dVar7 = srf02.x[1];
      dVar5 = distances[1];
      dVar9 = cos(srf02.psi[1]);
      dVar6 = srf02.y[1];
      dVar8 = distances[1];
      dVar7 = dVar5 * dVar9 + dVar7;
      dVar5 = sin(srf02.psi[1]);
      dVar6 = dVar8 * dVar5 + dVar6;
      atan2(dVar6,dVar7);
      dVar5 = sqr(dVar7);
      dVar8 = sqr(dVar6);
      distances[1] = sqrt(dVar5 + dVar8);
      dVar7 = srf02.x[2];
      dVar5 = distances[2];
      dVar9 = cos(srf02.psi[2]);
      dVar6 = srf02.y[2];
      dVar8 = distances[2];
      dVar7 = dVar5 * dVar9 + dVar7;
      dVar5 = sin(srf02.psi[2]);
      dVar6 = dVar8 * dVar5 + dVar6;
      atan2(dVar6,dVar7);
      dVar5 = sqr(dVar7);
      dVar8 = sqr(dVar6);
      distances[2] = sqrt(dVar5 + dVar8);
      distance_above = srf02.z[3] + distances[3];
      tv_00.tv_usec = tv.tv_sec;
      tv_00.tv_sec = _nbvtelemeters;
      tv.tv_usec = (__suseconds_t)distance_above;
      set_htelemeters_vectors_SRF02(distances + 0xf,distances1 + 0xf,4,tv_00);
      LeaveCriticalSection(&StateVariablesCS);
    }
    if (((chrono_period._68_4_ == 0) && (local_a20 = local_a20 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_a20)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001ad013:
      StopChronoQuick((CHRONO *)&errcount);
      if (srf02.I2CBus != (HANDLE)0x0) {
        fclose((FILE *)srf02.I2CBus);
        srf02.I2CBus = (HANDLE)0x0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectSRF02((SRF02 *)&x);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE SRF02Thread(void* pParam)
{
	SRF02 srf02;
	double x = 0, y = 0, z = 0;
	struct timeval tv;
	int nbhtelemeters = 0, nbvtelemeters = 0, nbtelemeters = 0;
	double angles[MAX_NB_DEVICES_SRF02];
	double distances[MAX_NB_DEVICES_SRF02];
	double distances1[MAX_NB_DEVICES_SRF02];
	double distances2[MAX_NB_DEVICES_SRF02];
	double distances3[MAX_NB_DEVICES_SRF02];
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	sprintf(szCfgFilePath, "SRF020.txt");

	memset(&srf02, 0, sizeof(SRF02));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//uSleep(1000*threadperiod);

		if (bPauseSRF02) 
		{
			if (bConnected)
			{
				printf("SRF02 paused.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSRF02) 
		{
			if (bConnected)
			{
				printf("Restarting a SRF02.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			bRestartSRF02 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSRF02(&srf02, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = srf02.threadperiod;
				uSleep(1000*threadperiod);

				memset(&tv, 0, sizeof(tv));
				memset(angles, 0, sizeof(angles));
				memset(distances, 0, sizeof(distances));
				memset(distances1, 0, sizeof(distances1));
				memset(distances2, 0, sizeof(distances2));
				memset(distances3, 0, sizeof(distances3));

				if (srf02.pfSaveFile != NULL)
				{
					fclose(srf02.pfSaveFile); 
					srf02.pfSaveFile = NULL;
				}
				if ((srf02.bSaveRawData)&&(srf02.pfSaveFile == NULL)) 
				{
					if (strlen(srf02.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", srf02.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "srf02");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					srf02.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (srf02.pfSaveFile == NULL) 
					{
						printf("Unable to create SRF02 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			//if ((srf02.telem1chan != -1)&&(srf02.telem2chan != -1)&&(srf02.telem3chan != -1)&&(srf02.telem4chan != -1)&&
			//	(srf02.telem5chan != -1))
			{
				// Assume 4 planar+1 up vertical telemeters...
				nbhtelemeters = 4; nbvtelemeters = 1; nbtelemeters = nbhtelemeters+nbvtelemeters;
				if (srf02.bParallel)
				{
					if (Get5TelemetersParallelSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4]) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(20);
				}
				else
				{
					if (Get5TelemetersSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4], 10) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(10);
				}
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
				if (srf02.bMedianFilter)
				{
					// Median filter with the 3 last values.
					memcpy(distances3, distances2, sizeof(distances));
					memcpy(distances2, distances1, sizeof(distances));
					memcpy(distances1, distances, sizeof(distances));
					for (i = 0; i < nbtelemeters; i++)
					{
						double tab_values[3] = { distances1[i], distances2[i], distances3[i] };					
						distances[i] = median(tab_values, 3);
					}
				}
				//printf("%f %f %f %f %f\n", distances[0], distances[1], distances[2], distances[3], distances[4]);
				EnterCriticalSection(&StateVariablesCS);
				i = 0;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 1;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 2;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 3;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));

				// Up vertical...
				i = 4;
				z = srf02.z[i]+distances[i];
				distance_above = z;

				set_htelemeters_vectors_SRF02(angles, distances, nbhtelemeters, tv);
				LeaveCriticalSection(&StateVariablesCS);
			}
			//else uSleep(1000*threadperiod);
		}

		//printf("SRF02Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}
	
	StopChronoQuick(&chrono_period);

	if (srf02.pfSaveFile != NULL)
	{
		fclose(srf02.pfSaveFile); 
		srf02.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSRF02(&srf02);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}